

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterList.h
# Opt level: O0

bool __thiscall bhf::ParameterList::Get<bool>(ParameterList *this,string *key,bool defaultValue)

{
  bool bVar1;
  runtime_error *this_00;
  pointer ppVar2;
  string local_50 [32];
  _Self local_30;
  _Self local_28;
  const_iterator it;
  bool defaultValue_local;
  string *key_local;
  ParameterList *this_local;
  
  it._M_node._7_1_ = defaultValue;
  local_28._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bhf::ParameterOption,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bhf::ParameterOption>_>_>
       ::find(&this->map,key);
  local_30._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bhf::ParameterOption,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bhf::ParameterOption>_>_>
       ::end(&this->map);
  bVar1 = std::operator==(&local_28,&local_30);
  if (!bVar1) {
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bhf::ParameterOption>_>
             ::operator->(&local_28);
    bVar1 = bhf::StringTo<bool>((string *)&(ppVar2->second).value,(bool)(it._M_node._7_1_ & 1));
    return bVar1;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+((char *)local_50,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 "invalid parameter ");
  std::runtime_error::runtime_error(this_00,local_50);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

T Get(const std::string& key, const T defaultValue = {}) const
    {
        auto it = map.find(key);
        if (it == map.end()) {
            throw std::runtime_error("invalid parameter " + key);
        }
        return StringTo<T>(it->second.value, defaultValue);
    }